

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

void dec_get_tb_start_pos(int w,int h,com_part_size_t part,int idx,int *pos_x,int *pos_y)

{
  int local_30;
  int local_2c;
  int y;
  int x;
  int *pos_y_local;
  int *pos_x_local;
  int idx_local;
  com_part_size_t part_local;
  int h_local;
  int w_local;
  
  local_2c = 0;
  local_30 = 0;
  switch(part) {
  case SIZE_2Nx2N:
    break;
  default:
    break;
  case SIZE_NxN:
    local_30 = ((idx / 2) * h) / 2;
    local_2c = ((idx % 2) * w) / 2;
    break;
  case SIZE_2NxhN:
    local_30 = idx * (h / 4);
    break;
  case SIZE_hNx2N:
    local_2c = idx * (w / 4);
  }
  *pos_x = local_2c;
  *pos_y = local_30;
  return;
}

Assistant:

void dec_get_tb_start_pos(int w, int h, com_part_size_t part, int idx, int *pos_x, int *pos_y)
{
    int x = 0, y = 0;

    switch (part) {
    case SIZE_2Nx2N:
        break;
    case SIZE_NxN:
        y = (idx / 2) * h / 2;
        x = (idx % 2) * w / 2;
        break;
    case SIZE_2NxhN:
        y = idx * (h / 4);
        break;
    case SIZE_hNx2N:
        x = idx * (w / 4);
        break;
    default:
        uavs3d_assert(0);
        break;
    }

    *pos_x = x;
    *pos_y = y;
}